

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O1

int expr_is_leaf(uint version,int id)

{
  uint uVar1;
  expr_t *peVar2;
  
  peVar2 = expr_get_by_id(version,id);
  uVar1 = 0;
  if ((peVar2 != (expr_t *)0x0) && (peVar2->stack_arity == 0)) {
    uVar1 = (uint)(peVar2->return_type != 0);
  }
  return uVar1;
}

Assistant:

int
expr_is_leaf(
    unsigned int version,
    int id)
{
    const expr_t* expr = expr_get_by_id(version, id);

    if (!expr)
        return 0;

    return expr->stack_arity == 0 &&
           expr->return_type != 0;
}